

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O0

uint64_t aom_sum_sse_2d_i16_c(int16_t *src,int src_stride,int width,int height,int *sum)

{
  short sVar1;
  int16_t v;
  int64_t ss;
  int16_t *srcp;
  int c;
  int r;
  int *sum_local;
  int height_local;
  int width_local;
  int src_stride_local;
  int16_t *src_local;
  
  ss = 0;
  srcp = src;
  for (r = 0; r < height; r = r + 1) {
    for (c = 0; c < width; c = c + 1) {
      sVar1 = srcp[c];
      ss = (int)sVar1 * (int)sVar1 + ss;
      *sum = (int)sVar1 + *sum;
    }
    srcp = srcp + src_stride;
  }
  return ss;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_c(const int16_t *src, int src_stride, int width,
                              int height, int *sum) {
  int r, c;
  int16_t *srcp = (int16_t *)src;
  int64_t ss = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const int16_t v = srcp[c];
      ss += v * v;
      *sum += v;
    }
    srcp += src_stride;
  }
  return ss;
}